

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O1

sz_ssize_t __thiscall sznet::net::Buffer::readFd(Buffer *this,sz_sock fd,int *savedErrno)

{
  size_t sVar1;
  pointer pcVar2;
  int iVar3;
  sz_ssize_t sVar4;
  size_t __n;
  
  if ((long)this->m_wrapSize <= (long)this->m_writerIndex) {
    sVar1 = this->m_readerIndex;
    if (sVar1 != this->m_nCheapPrepend) {
      pcVar2 = (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      __n = this->m_writerIndex - sVar1;
      memmove(pcVar2 + this->m_nCheapPrepend,pcVar2 + sVar1,__n);
      this->m_readerIndex = this->m_nCheapPrepend;
      this->m_writerIndex = __n + this->m_nCheapPrepend;
    }
  }
  pcVar2 = (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar4 = sockets::sz_read(fd,pcVar2 + this->m_writerIndex,
                           *(int *)&(this->m_buffer).super__Vector_base<char,_std::allocator<char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                           ((int)this->m_writerIndex + (int)pcVar2));
  if (sVar4 < 0) {
    iVar3 = sz_getlasterr();
    *savedErrno = iVar3;
  }
  else {
    this->m_writerIndex = this->m_writerIndex + sVar4;
  }
  return sVar4;
}

Assistant:

sz_ssize_t Buffer::readFd(sockets::sz_sock fd, int* savedErrno)
{
	// �ж��Ƿ���Ҫ�ص�
	if ((begin() + m_writerIndex) >= (begin() + m_wrapSize))
	{
		wrapBuffer();
	}

	char* buf = (begin() + m_writerIndex);
	const size_t writable = writableBytes();
	const sz_ssize_t n = sockets::sz_read(fd, buf, static_cast<int>(writable));
	if (n < 0)
	{
		*savedErrno = sz_getlasterr();
	}
	else
	{
		m_writerIndex += n;
	}
	
	return n;
}